

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O0

void __thiscall
cornerstone::raft_server::handle_ext_resp
          (raft_server *this,ptr<resp_msg> *resp,ptr<rpc_exception> *err)

{
  bool bVar1;
  msg_type srv_id;
  msg_type mVar2;
  raft_server *this_00;
  element_type *peVar3;
  ulong uVar4;
  element_type *peVar5;
  element_type *peVar6;
  ulong uVar7;
  element_type *peVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char *__s;
  allocator<char> *__a;
  element_type *peVar9;
  element_type *peVar10;
  __shared_ptr *in_RDX;
  long in_RDI;
  rpc_exception *in_stack_00000048;
  raft_server *in_stack_00000050;
  ptr<snapshot> nil_snap;
  ptr<snapshot_sync_ctx> sync_ctx;
  lock_guard<std::recursive_mutex> guard;
  peer *in_stack_fffffffffffff9d8;
  strfmt<200> *in_stack_fffffffffffff9e0;
  ptr<snapshot> *in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f4;
  unsigned_long in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa00;
  char *in_stack_fffffffffffffa08;
  strfmt<200> *in_stack_fffffffffffffa10;
  char *in_stack_fffffffffffffa18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa20;
  allocator<char> local_439;
  strfmt<200> local_438;
  resp_msg *in_stack_fffffffffffffc98;
  raft_server *in_stack_fffffffffffffca0;
  allocator<char> local_341 [9];
  ulong in_stack_fffffffffffffcc8;
  raft_server *in_stack_fffffffffffffcd0;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [55];
  allocator<char> local_271;
  string local_270 [55];
  allocator<char> local_239;
  string local_238 [39];
  allocator<char> local_211;
  string local_210 [39];
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  strfmt<200> local_120;
  string local_50 [32];
  undefined4 local_30;
  __shared_ptr *local_18;
  
  local_18 = in_RDX;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffff9e0,
             (mutex_type *)in_stack_fffffffffffff9d8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  if (bVar1) {
    std::__shared_ptr_access<cornerstone::rpc_exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<cornerstone::rpc_exception,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)in_stack_fffffffffffff9e0);
    handle_ext_resp_err(in_stack_00000050,in_stack_00000048);
    local_30 = 1;
    goto LAB_001e179d;
  }
  this_00 = (raft_server *)
            std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1e0652);
  strfmt<200>::strfmt(&local_120,
                      "Receive an extended %s message from peer %d with Result=%d, Term=%llu, NextIndex=%llu"
                     );
  peVar3 = std::__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e067d);
  srv_id = msg_base::get_type(&peVar3->super_msg_base);
  peVar3 = std::__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e06b9);
  msg_base::get_src(&peVar3->super_msg_base);
  peVar3 = std::__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e06d7);
  resp_msg::get_accepted(peVar3);
  peVar3 = std::__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e0709);
  msg_base::get_term(&peVar3->super_msg_base);
  peVar3 = std::__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e0728);
  resp_msg::get_next_idx(peVar3);
  strfmt<200>::fmt<char_const*,int,int,unsigned_long,unsigned_long>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
             (int)((ulong)in_stack_fffffffffffffa00 >> 0x20),(int)in_stack_fffffffffffffa00,
             in_stack_fffffffffffff9f8,CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0)
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
             (allocator<char> *)in_stack_fffffffffffffa10);
  (*this_00->_vptr_raft_server[2])(this_00,local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_121);
  peVar3 = std::__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e07ed);
  mVar2 = msg_base::get_type(&peVar3->super_msg_base);
  switch(mVar2) {
  case sync_log_response:
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x1a0));
    if (bVar1) {
      peVar8 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e08ad);
      peer::resume_hb_speed(peVar8);
      peVar8 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e08cb);
      peVar3 = std::
               __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e08e0);
      uVar4 = resp_msg::get_next_idx(peVar3);
      peer::set_next_log_idx(peVar8,uVar4);
      peVar8 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e091d);
      peVar3 = std::
               __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e0932);
      uVar4 = resp_msg::get_next_idx(peVar3);
      peer::set_matched_idx(peVar8,uVar4 - 1);
      peVar3 = std::
               __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e096b);
      resp_msg::get_next_idx(peVar3);
      sync_log_to_new_srv(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    }
    break;
  default:
    peVar9 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e165c);
    strfmt<200>::strfmt(&local_438,
                        "received an unexpected response message type %s, for safety, stepping down"
                       );
    peVar3 = std::
             __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e1684);
    msg_base::get_type(&peVar3->super_msg_base);
    strfmt<200>::fmt<char_const*>(in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
               (allocator<char> *)in_stack_fffffffffffffa10);
    (*peVar9->_vptr_logger[5])(peVar9,&stack0xfffffffffffffc98);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc98);
    std::allocator<char>::~allocator(&local_439);
    std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
              ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
               0x1e1727);
    peVar10 = std::
              __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1e172f);
    (*peVar10->_vptr_state_mgr[8])(peVar10,0xffffffff);
    exit(-1);
  case join_cluster_response:
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x1a0));
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e09c5);
      bVar1 = resp_msg::get_accepted(peVar3);
      if (bVar1) {
        peVar9 = std::
                 __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e09fa);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                   (allocator<char> *)in_stack_fffffffffffffa10);
        (*peVar9->_vptr_logger[2])(peVar9,local_148);
        std::__cxx11::string::~string(local_148);
        std::allocator<char>::~allocator(&local_149);
        peVar3 = std::
                 __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e0a77);
        resp_msg::get_next_idx(peVar3);
        sync_log_to_new_srv(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      }
      else {
        peVar9 = std::
                 __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e0b02);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                   (allocator<char> *)in_stack_fffffffffffffa10);
        (*peVar9->_vptr_logger[2])(peVar9,local_170);
        std::__cxx11::string::~string(local_170);
        std::allocator<char>::~allocator(&local_171);
      }
    }
    else {
      peVar9 = std::
               __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e0bd6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                 (allocator<char> *)in_stack_fffffffffffffa10);
      (*peVar9->_vptr_logger[2])(peVar9,local_198);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator(&local_199);
    }
    break;
  case leave_cluster_response:
    peVar3 = std::
             __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e0ca3);
    bVar1 = resp_msg::get_accepted(peVar3);
    if (!bVar1) {
      peVar9 = std::
               __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e0cd9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                 (allocator<char> *)in_stack_fffffffffffffa10);
      (*peVar9->_vptr_logger[2])(peVar9,local_1c0);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator(&local_1c1);
      local_30 = 1;
      goto LAB_001e179d;
    }
    peVar9 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e0db6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
               (allocator<char> *)in_stack_fffffffffffffa10);
    (*peVar9->_vptr_logger[2])(peVar9,local_1e8);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    peVar3 = std::
             __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e0e33);
    msg_base::get_src(&peVar3->super_msg_base);
    rm_srv_from_cluster(this_00,srv_id);
    break;
  case install_snapshot_response:
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x1a0));
    if (!bVar1) {
      peVar9 = std::
               __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e0ed8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                 (allocator<char> *)in_stack_fffffffffffffa10);
      (*peVar9->_vptr_logger[3])(peVar9,local_210);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator(&local_211);
      local_30 = 1;
      goto LAB_001e179d;
    }
    peVar3 = std::
             __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e0fae);
    bVar1 = resp_msg::get_accepted(peVar3);
    if (!bVar1) {
      peVar9 = std::
               __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e0fe4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                 (allocator<char> *)in_stack_fffffffffffffa10);
      (*peVar9->_vptr_logger[3])(peVar9,local_238);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator(&local_239);
      local_30 = 1;
      goto LAB_001e179d;
    }
    std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1e10c1);
    peer::get_snapshot_sync_ctx(in_stack_fffffffffffff9d8);
    bVar1 = std::operator==((shared_ptr<cornerstone::snapshot_sync_ctx> *)in_stack_fffffffffffff9e0,
                            in_stack_fffffffffffff9d8);
    if (bVar1) {
      peVar9 = std::
               __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e1101);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                 (allocator<char> *)in_stack_fffffffffffffa10);
      (*peVar9->_vptr_logger[5])(peVar9,local_270);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator(&local_271);
      std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::operator->
                ((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_> *)
                 0x1e1182);
      peVar10 = std::
                __shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cornerstone::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1e118a);
      (*peVar10->_vptr_state_mgr[8])(peVar10,0xffffffff);
      exit(-1);
    }
    peVar3 = std::
             __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e1216);
    uVar4 = resp_msg::get_next_idx(peVar3);
    peVar5 = std::
             __shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e1235);
    snapshot_sync_ctx::get_snapshot(peVar5);
    peVar6 = std::
             __shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e1254);
    uVar7 = snapshot::size(peVar6);
    if (uVar4 < uVar7) {
      peVar5 = std::
               __shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e148e);
      peVar3 = std::
               __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e14a0);
      uVar4 = resp_msg::get_next_idx(peVar3);
      snapshot_sync_ctx::set_offset(peVar5,uVar4);
      this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1e14d4);
      strfmt<100>::strfmt((strfmt<100> *)(local_341 + 1),
                          "continue to send snapshot to new server at offset %llu");
      peVar3 = std::
               __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e14fc);
      __s = (char *)resp_msg::get_next_idx(peVar3);
      __a = (allocator<char> *)
            strfmt<100>::fmt<unsigned_long>
                      ((strfmt<100> *)in_stack_fffffffffffff9e0,
                       (unsigned_long)in_stack_fffffffffffff9d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
      (**(code **)(*(long *)this_01 + 0x10))(this_01,local_2d0);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator(local_341);
    }
    else {
      std::shared_ptr<cornerstone::snapshot>::shared_ptr
                ((shared_ptr<cornerstone::snapshot> *)0x1e128c);
      peVar9 = std::
               __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e12a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                 (allocator<char> *)in_stack_fffffffffffffa10);
      (*peVar9->_vptr_logger[2])(peVar9,local_2a8);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1e1324);
      peer::set_snapshot_in_sync
                ((peer *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                 in_stack_fffffffffffff9e8);
      peVar8 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e134a);
      peVar5 = std::
               __shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e135f);
      snapshot_sync_ctx::get_snapshot(peVar5);
      peVar6 = std::
               __shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e137e);
      uVar4 = snapshot::get_last_log_idx(peVar6);
      peer::set_next_log_idx(peVar8,uVar4 + 1);
      peVar8 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e13b8);
      peVar5 = std::
               __shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e13ca);
      snapshot_sync_ctx::get_snapshot(peVar5);
      peVar6 = std::
               __shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e13e3);
      uVar4 = snapshot::get_last_log_idx(peVar6);
      peer::set_matched_idx(peVar8,uVar4);
      std::shared_ptr<cornerstone::snapshot>::~shared_ptr
                ((shared_ptr<cornerstone::snapshot> *)0x1e1410);
    }
    peVar8 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e15dd);
    peer::get_next_log_idx(peVar8);
    sync_log_to_new_srv(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    std::shared_ptr<cornerstone::snapshot_sync_ctx>::~shared_ptr
              ((shared_ptr<cornerstone::snapshot_sync_ctx> *)0x1e160d);
    break;
  case prevote_response:
    std::__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)in_stack_fffffffffffff9e0);
    handle_prevote_resp(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  }
  local_30 = 0;
LAB_001e179d:
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1e17aa);
  return;
}

Assistant:

void raft_server::handle_ext_resp(ptr<resp_msg>& resp, const ptr<rpc_exception>& err)
{
    recur_lock(lock_);
    if (err)
    {
        handle_ext_resp_err(*err);
        return;
    }

    l_->debug(lstrfmt("Receive an extended %s message from peer %d with Result=%d, Term=%llu, NextIndex=%llu")
                  .fmt(
                      __msg_type_str[resp->get_type()],
                      resp->get_src(),
                      resp->get_accepted() ? 1 : 0,
                      resp->get_term(),
                      resp->get_next_idx()));

    switch (resp->get_type())
    {
        case msg_type::sync_log_response:
            if (srv_to_join_)
            {
                // we are reusing heartbeat interval value to indicate when to stop retry
                srv_to_join_->resume_hb_speed();
                srv_to_join_->set_next_log_idx(resp->get_next_idx());
                srv_to_join_->set_matched_idx(resp->get_next_idx() - 1);
                sync_log_to_new_srv(resp->get_next_idx());
            }
            break;
        case msg_type::join_cluster_response:
            if (srv_to_join_)
            {
                if (resp->get_accepted())
                {
                    l_->debug("new server confirms it will join, start syncing logs to it");
                    sync_log_to_new_srv(resp->get_next_idx());
                }
                else
                {
                    l_->debug("new server cannot accept the invitation, give up");
                }
            }
            else
            {
                l_->debug("no server to join, drop the message");
            }
            break;
        case msg_type::leave_cluster_response:
            if (!resp->get_accepted())
            {
                l_->debug("peer doesn't accept to stepping down, stop proceeding");
                return;
            }

            l_->debug("peer accepted to stepping down, removing this server from cluster");
            rm_srv_from_cluster(resp->get_src());
            break;
        case msg_type::install_snapshot_response:
        {
            if (!srv_to_join_)
            {
                l_->info("no server to join, the response must be very old.");
                return;
            }

            if (!resp->get_accepted())
            {
                l_->info("peer doesn't accept the snapshot installation request");
                return;
            }

            ptr<snapshot_sync_ctx> sync_ctx = srv_to_join_->get_snapshot_sync_ctx();
            if (sync_ctx == nilptr)
            {
                l_->err("Bug! SnapshotSyncContext must not be null");
                ctx_->state_mgr_->system_exit(-1);
                ::exit(-1);
                return;
            }

            if (resp->get_next_idx() >= sync_ctx->get_snapshot()->size())
            {
                // snapshot is done
                ptr<snapshot> nil_snap;
                l_->debug("snapshot has been copied and applied to new server, continue to sync logs after snapshot");
                srv_to_join_->set_snapshot_in_sync(nil_snap);
                srv_to_join_->set_next_log_idx(sync_ctx->get_snapshot()->get_last_log_idx() + 1);
                srv_to_join_->set_matched_idx(sync_ctx->get_snapshot()->get_last_log_idx());
            }
            else
            {
                sync_ctx->set_offset(resp->get_next_idx());
                l_->debug(sstrfmt("continue to send snapshot to new server at offset %llu").fmt(resp->get_next_idx()));
            }

            sync_log_to_new_srv(srv_to_join_->get_next_log_idx());
        }
        break;
        case msg_type::prevote_response:
            handle_prevote_resp(*resp);
            break;
        default:
            l_->err(lstrfmt("received an unexpected response message type %s, for safety, stepping down")
                        .fmt(__msg_type_str[resp->get_type()]));
            ctx_->state_mgr_->system_exit(-1);
            ::exit(-1);
            break;
    }
}